

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.c
# Opt level: O0

GLFWEvent * glfwEventPush(void)

{
  GLFWEvent *local_10;
  GLFWEvent *event;
  
  if (GLFWEventPool == (GLFWEvent *)0x0) {
    if (GLFWEventPoolSize != 0) {
      __assert_fail("GLFWEventPoolSize == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/creationix[P]lit-glfw/wrapper.c"
                    ,0x2d,"GLFWEvent *glfwEventPush()");
    }
    local_10 = (GLFWEvent *)malloc(0x28);
  }
  else {
    GLFWEventPoolSize = GLFWEventPoolSize + -1;
    local_10 = GLFWEventPool;
    GLFWEventPool = GLFWEventPool->next;
  }
  local_10->next = (GLFWEvent *)0x0;
  if (GLFWEventTail == (GLFWEvent *)0x0) {
    GLFWEventHead = local_10;
  }
  else {
    GLFWEventTail->next = local_10;
  }
  GLFWEventTail = local_10;
  return local_10;
}

Assistant:

static GLFWEvent* glfwEventPush() {
  GLFWEvent* event;
  // If there is an old event in the pool, reuse it.
  if (GLFWEventPool) {
    GLFWEventPoolSize--;
    event = GLFWEventPool;
    GLFWEventPool = event->next;
  }
  // Otherwise allocate a new event.
  else {
    assert(GLFWEventPoolSize == 0);
    event = malloc(sizeof(*event));
  }
  event->next = NULL;
  if (GLFWEventTail) {
    GLFWEventTail->next = event;
  }
  else {
   GLFWEventHead = event;
  }
  GLFWEventTail = event;
  return event;
}